

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

DecodeStatus
decodeInstruction(uint8_t *DecodeTable,MCInst *MI,uint64_t insn,uint64_t Address,MCRegisterInfo *MRI
                 ,int feature)

{
  ushort uVar1;
  uint Idx;
  DecodeStatus DVar2;
  ushort *puVar3;
  uint64_t uVar4;
  uint64_t in_RDX;
  MCInst *in_RSI;
  ushort *in_RDI;
  int in_R9D;
  bool bVar5;
  bool bVar6;
  _Bool Fail;
  _Bool Pred;
  uint64_t NegativeMask;
  uint64_t PositiveMask;
  uint64_t FieldValue;
  uint64_t Val;
  uint DecodeIdx;
  uint Opc;
  uint PIdx;
  uint NumToSkip;
  uint Len;
  uint Start;
  DecodeStatus S;
  uint32_t ExpectedValue;
  uint32_t CurFieldValue;
  uint8_t *Ptr;
  uint64_t Bits;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  uint64_t in_stack_ffffffffffffff70;
  MCInst *in_stack_ffffffffffffff78;
  uint64_t in_stack_ffffffffffffff80;
  uint64_t in_stack_ffffffffffffff88;
  uint Idx_00;
  DecodeStatus in_stack_ffffffffffffff90;
  uint local_5c;
  uint local_58;
  undefined4 local_54;
  undefined4 local_50;
  uint local_4c;
  ushort *local_48;
  uint64_t local_40;
  uint64_t local_20;
  MCInst *local_18;
  ushort *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = getFeatureBits(in_R9D);
  local_48 = local_10;
  local_4c = 0;
  local_54 = 3;
  do {
    Idx_00 = (uint)(in_stack_ffffffffffffff88 >> 0x20);
    Idx = (byte)*local_48 - 1;
    switch(Idx) {
    case 0:
      local_58 = (uint)*(byte *)((long)local_48 + 1);
      local_5c = (uint)(byte)local_48[1];
      local_48 = (ushort *)((long)local_48 + 3);
      uVar4 = fieldFromInstruction(local_20,local_58,local_5c);
      local_4c = (uint)uVar4;
      break;
    case 1:
      local_48 = (ushort *)((long)local_48 + 1);
      in_stack_ffffffffffffff88 = decodeULEB128((uint8_t *)local_48,&local_5c);
      puVar3 = (ushort *)((long)local_48 + (ulong)local_5c);
      local_48 = puVar3 + 1;
      if (in_stack_ffffffffffffff88 != local_4c) {
        local_48 = (ushort *)((long)local_48 + (ulong)*puVar3);
      }
      break;
    case 2:
      local_58 = (uint)*(byte *)((long)local_48 + 1);
      local_5c = (uint)(byte)local_48[1];
      local_48 = local_48 + 1;
      in_stack_ffffffffffffff80 = fieldFromInstruction(local_20,local_58,local_5c);
      local_48 = (ushort *)((long)local_48 + 1);
      uVar4 = decodeULEB128((uint8_t *)local_48,&local_5c);
      local_50 = (undefined4)uVar4;
      puVar3 = (ushort *)((long)local_48 + (ulong)local_5c);
      local_48 = puVar3 + 1;
      if ((uVar4 & 0xffffffff) != in_stack_ffffffffffffff80) {
        local_48 = (ushort *)((long)local_48 + (ulong)*puVar3);
      }
      break;
    case 3:
      local_48 = (ushort *)((long)local_48 + 1);
      decodeULEB128((uint8_t *)local_48,&local_5c);
      puVar3 = (ushort *)((long)local_48 + (ulong)local_5c);
      local_48 = puVar3 + 1;
      uVar1 = *puVar3;
      in_stack_ffffffffffffff6f =
           checkDecoderPredicate(Idx,CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      if (!(bool)in_stack_ffffffffffffff6f) {
        local_48 = (ushort *)((long)local_48 + (ulong)uVar1);
      }
      break;
    case 4:
      local_48 = (ushort *)((long)local_48 + 1);
      uVar4 = decodeULEB128((uint8_t *)local_48,&local_5c);
      local_48 = (ushort *)((long)local_48 + (ulong)local_5c);
      decodeULEB128((uint8_t *)local_48,&local_5c);
      local_48 = (ushort *)((long)local_48 + (ulong)local_5c);
      MCInst_setOpcode(local_18,(uint)uVar4);
      DVar2 = decodeToMCInst(in_stack_ffffffffffffff90,Idx_00,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             (void *)CONCAT17(in_stack_ffffffffffffff6f,
                                              CONCAT16(in_stack_ffffffffffffff6e,
                                                       in_stack_ffffffffffffff68)));
      return DVar2;
    case 5:
      local_48 = (ushort *)((long)local_48 + 1);
      in_stack_ffffffffffffff78 = (MCInst *)decodeULEB128((uint8_t *)local_48,&local_5c);
      local_48 = (ushort *)((long)local_48 + (ulong)local_5c);
      in_stack_ffffffffffffff70 = decodeULEB128((uint8_t *)local_48,&local_5c);
      local_48 = (ushort *)((long)local_48 + (ulong)local_5c);
      bVar5 = (local_20 & (ulong)in_stack_ffffffffffffff78) != 0;
      bVar6 = ((local_20 ^ 0xffffffffffffffff) & in_stack_ffffffffffffff70) != 0;
      in_stack_ffffffffffffff5f = bVar5 || bVar6;
      in_stack_ffffffffffffff6e = in_stack_ffffffffffffff5f;
      if (bVar5 || bVar6) {
        local_54 = 1;
      }
      break;
    case 6:
      return MCDisassembler_Fail;
    default:
      return MCDisassembler_Fail;
    }
  } while( true );
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			checkPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}